

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall
QItemDelegate::drawDecoration
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          QPixmap *pixmap)

{
  long lVar1;
  bool bVar2;
  Int IVar3;
  QItemDelegatePrivate *this_00;
  ulong uVar4;
  QFlags_conflict1 *in_RCX;
  QRect *in_RDX;
  QSize *in_RSI;
  LayoutDirection in_EDI;
  QFlags<QStyle::StateFlag> *in_R8;
  long in_FS_OFFSET;
  QItemDelegatePrivate *d;
  QPixmap pm;
  QPoint p;
  undefined4 in_stack_ffffffffffffff58;
  StateFlag in_stack_ffffffffffffff5c;
  QRect *in_stack_ffffffffffffff60;
  QPixmap *in_stack_ffffffffffffff68;
  QPixmap *pm_00;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_54;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QItemDelegate *)0x85526f);
  uVar4 = QIcon::isNull();
  if ((uVar4 & 1) == 0) {
    QIcon::paint((QPainter *)&this_00->tmp,(QRect *)in_RSI,in_RCX,in_RDX[4].y1.m_i,
                 (this_00->tmp).mode);
  }
  else {
    uVar4 = QPixmap::isNull();
    if (((uVar4 & 1) == 0) && (bVar2 = QRect::isValid(in_stack_ffffffffffffff60), bVar2)) {
      iVar5 = (in_RDX->y2).m_i;
      QPixmap::size();
      QStyle::alignedRect(in_EDI,(Alignment)in_stack_ffffffffffffffcc.i,in_RSI,in_RDX);
      QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QFlags<QStyle::StateFlag>::operator&
                ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffcc);
      if (IVar3 == 0) {
        QPainter::drawPixmap
                  ((QPainter *)this_00,(QPoint *)CONCAT44(iVar5,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
      }
      else {
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        pm_00 = (QPixmap *)&in_RDX[2].x2;
        local_54.super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorage<QStyle::StateFlag>)
             QFlags<QStyle::StateFlag>::operator&(in_R8,in_stack_ffffffffffffff5c);
        ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_54);
        selectedPixmap((QPixmap *)this_00,(QPalette *)CONCAT44(iVar5,in_stack_ffffffffffffff70),
                       SUB81((ulong)pm_00 >> 0x38,0));
        QPainter::drawPixmap
                  ((QPainter *)this_00,(QPoint *)CONCAT44(iVar5,in_stack_ffffffffffffff70),pm_00);
        QPixmap::~QPixmap((QPixmap *)&local_50);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::drawDecoration(QPainter *painter, const QStyleOptionViewItem &option,
                                   const QRect &rect, const QPixmap &pixmap) const
{
    Q_D(const QItemDelegate);
    // if we have an icon, we ignore the pixmap
    if (!d->tmp.icon.isNull()) {
        d->tmp.icon.paint(painter, rect, option.decorationAlignment,
                          d->tmp.mode, d->tmp.state);
        return;
    }

    if (pixmap.isNull() || !rect.isValid())
        return;
    QPoint p = QStyle::alignedRect(option.direction, option.decorationAlignment,
                                   pixmap.size(), rect).topLeft();
    if (option.state & QStyle::State_Selected) {
        const QPixmap pm = selectedPixmap(pixmap, option.palette, option.state & QStyle::State_Enabled);
        painter->drawPixmap(p, pm);
    } else {
        painter->drawPixmap(p, pixmap);
    }
}